

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::canEnterLiteral(ClauseMatcher *this,CodeOp *op)

{
  bool bVar1;
  ILStruct *si;
  size_t sVar2;
  LiteralMatcher *pLVar3;
  LiteralMatcher *this_00;
  MatchInfo **ppMVar4;
  ClauseMatcher *in_RSI;
  long in_RDI;
  MatchInfo *mi;
  size_t matchIndex;
  ILStruct *prevILS;
  size_t ilIndex;
  ILStruct *ils;
  uint in_stack_ffffffffffffffac;
  ILStruct *this_01;
  ulong local_38;
  LiteralMatcher *in_stack_ffffffffffffffd0;
  ILStruct *this_02;
  ILStruct *sq;
  bool local_1;
  
  si = CodeTree::CodeOp::getILS((CodeOp *)0x2f8d52);
  if ((si->timestamp == *(uint *)(*(long *)(in_RDI + 8) + 0xc)) && ((si->visited & 1U) != 0)) {
    local_1 = false;
  }
  else {
    sVar2 = Lib::
            Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
            ::size((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                    *)(in_RDI + 0x30));
    if (1 < sVar2) {
      if (si->varCnt != 0) {
        Lib::
        Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
        ::top((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
               *)(in_RDI + 0x30));
        pLVar3 = Lib::
                 Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                 ::operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                               *)0x2f8dbb);
        bVar1 = LiteralMatcher::eagerlyMatched(pLVar3);
        if (!bVar1) {
          Lib::
          Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
          ::top((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                 *)(in_RDI + 0x30));
          Lib::
          Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                        *)0x2f8ddd);
          LiteralMatcher::doEagerMatching(in_stack_ffffffffffffffd0);
        }
      }
      this_02 = (ILStruct *)0x0;
      while (sq = this_02,
            sVar2 = Lib::
                    Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                    ::size((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                            *)(in_RDI + 0x30)), this_02 < (ILStruct *)(sVar2 - 1)) {
        Lib::
        Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
        ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                      *)(in_RDI + 0x30),(size_t)sq);
        Lib::
        Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                    *)0x2f8e36);
        pLVar3 = (LiteralMatcher *)LiteralMatcher::getILS((LiteralMatcher *)0x2f8e3e);
        if (*(uint *)&(pLVar3->super_Matcher).super_BaseMatcher.ft != 0) {
          Lib::
          Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
          ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                        *)(in_RDI + 0x30),(size_t)sq);
          this_00 = Lib::
                    Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                    ::operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                                  *)0x2f8e69);
          bVar1 = LiteralMatcher::eagerlyMatched(this_00);
          if (!bVar1) {
            Lib::
            Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
            ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                          *)(in_RDI + 0x30),(size_t)sq);
            Lib::
            Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                          *)0x2f8e90);
            LiteralMatcher::doEagerMatching(pLVar3);
          }
        }
        local_38 = (ulong)si->matchCnt;
        while (local_38 != 0) {
          local_38 = local_38 - 1;
          ppMVar4 = CodeTree::ILStruct::getMatch(this_02,in_stack_ffffffffffffffac);
          this_01 = (ILStruct *)*ppMVar4;
          bVar1 = existsCompatibleMatch(in_RSI,si,(MatchInfo *)sq,(ILStruct *)pLVar3);
          if (!bVar1) {
            CodeTree::ILStruct::deleteMatch(this_01,(uint)((ulong)in_RDI >> 0x20));
          }
        }
        if (si->matchCnt == 0) {
          return false;
        }
        this_02 = (ILStruct *)((long)&sq->depth + 1);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool ClauseCodeTree::ClauseMatcher::canEnterLiteral(CodeOp* op)
{
  ASS(op->isLitEnd());
  ASS_EQ(lms.top()->op, op);

  ILStruct* ils=op->getILS();
  if(ils->timestamp==tree->_curTimeStamp && ils->visited) {
    return false;
  }

  if(lms.size()>1) {
    //we have already matched and entered some index literals, so we
    //will check for compatibility of variable assignments
    if(ils->varCnt && !lms.top()->eagerlyMatched()) {
      lms.top()->doEagerMatching();
      RSTAT_MST_INC("match count", lms.size()-1, lms.top()->getILS()->matchCnt);
    }
    for(size_t ilIndex=0;ilIndex<lms.size()-1;ilIndex++) {
      ILStruct* prevILS=lms[ilIndex]->getILS();
      if(prevILS->varCnt && !lms[ilIndex]->eagerlyMatched()) {
	lms[ilIndex]->doEagerMatching();
	RSTAT_MST_INC("match count", ilIndex, lms[ilIndex]->getILS()->matchCnt);
      }

      size_t matchIndex=ils->matchCnt;
      while(matchIndex!=0) {
	matchIndex--;
	MatchInfo* mi=ils->getMatch(matchIndex);
	if(!existsCompatibleMatch(ils, mi, prevILS)) {
	  ils->deleteMatch(matchIndex); //decreases ils->matchCnt
	}
      }
      if(!ils->matchCnt) {
	return false;
      }
    }
  }

  return true;
}